

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O1

int PARMCI_Init_args(int *argc,char ***argv)

{
  int iVar1;
  
  iVar1 = comex_init_args(argc,argv);
  if (iVar1 != 0) {
    __assert_fail("COMEX_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x1a2,"int PARMCI_Init_args(int *, char ***)");
  }
  iVar1 = comex_group_comm(0,&ARMCI_COMM_WORLD);
  if (iVar1 == 0) {
    armci_init_domains(ARMCI_COMM_WORLD);
    ARMCI_Default_Proc_Group = 0;
    return 0;
  }
  __assert_fail("COMEX_SUCCESS == rc",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                ,0x1a4,"int PARMCI_Init_args(int *, char ***)");
}

Assistant:

int PARMCI_Init_args(int *argc, char ***argv)
{
    int rc = comex_init_args(argc, argv);
    assert(COMEX_SUCCESS == rc);
    rc = comex_group_comm(COMEX_GROUP_WORLD, &ARMCI_COMM_WORLD);
    assert(COMEX_SUCCESS == rc);
    armci_init_domains(ARMCI_COMM_WORLD);
    ARMCI_Default_Proc_Group = 0;
    return rc;
}